

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void parse_vm(options_description *opts,variables_map *vm)

{
  size_type sVar1;
  void *this;
  allocator local_39;
  string local_38 [32];
  variables_map *local_18;
  variables_map *vm_local;
  options_description *opts_local;
  
  local_18 = vm;
  vm_local = (variables_map *)opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"help",&local_39);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(vm + 0x10),(key_type *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (sVar1 != 0) {
    this = (void *)boost::program_options::operator<<
                             ((ostream *)&std::cout,(options_description *)vm_local);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void parse_vm(const options_description &opts, const variables_map &vm)
{
    if (vm.count("help")) {
        cout << opts << endl;
    }
}